

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

size_t gvector_copy(gvector dst,gvector_const src)

{
  gvector local_30;
  size_t len;
  gvector_const src_local;
  gvector dst_local;
  
  if (((dst == (gvector)0x0) || (src == (gvector_const)0x0)) ||
     (*(long *)((long)dst + -0x10) != *(long *)((long)src + -0x10))) {
    dst_local = (gvector)0x0;
  }
  else {
    if (*(ulong *)((long)dst + -8) < *(ulong *)((long)src + -8)) {
      local_30 = *(gvector *)((long)dst + -8);
    }
    else {
      local_30 = *(gvector *)((long)src + -8);
    }
    memcpy(dst,src,(long)local_30 * *(long *)((long)src + -0x10));
    dst_local = local_30;
  }
  return (size_t)dst_local;
}

Assistant:

size_t gvector_copy(gvector dst, gvector_const src)
{
  if (dst && src)
  {
    if (gvector_size(dst) == gvector_size(src))
    {
      size_t len = MIN(gvector_len(dst), gvector_len(src));
      memcpy(dst, src, len * gvector_size(src));
      return len;
    }
  }
  return 0;
}